

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_size::test_method(addrman_size *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  __single_object _Var2;
  readonly_property65 rVar3;
  bool bVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> time;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  CAddress *pCVar6;
  iterator pvVar7;
  undefined ***pppuVar8;
  vector<CAddress,_std::allocator<CAddress>_> *pvVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  initializer_list<CAddress> __l;
  const_string file_04;
  const_string file_05;
  initializer_list<CAddress> __l_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<CAddress> __l_01;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  check_type cVar10;
  undefined8 in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  undefined8 in_stack_fffffffffffffa18;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  vector<CAddress,_std::allocator<CAddress>_> local_4c8;
  char **local_4b0;
  allocator_type local_4a1;
  vector<CAddress,_std::allocator<CAddress>_> local_4a0;
  assertion_result local_488;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  __single_object addrman;
  direct_or_indirect local_1d8;
  shared_count sStack_1c8;
  char **local_1c0;
  CService local_1a0;
  CService i2p_addr;
  CAddress addr3;
  CService local_118;
  CAddress addr2;
  CService local_b8;
  CAddress addr1;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  addr1.super_CService.super_CNetAddr.m_addr._union._0_4_ =
       GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr1,"252.2.2.2",(allocator<char> *)&addr2);
  ResolveIP(&source,(string *)&addr1);
  std::__cxx11::string::~string((string *)&addr1);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x472;
  file.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_200,msg);
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_208 = "";
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar6 = &addr2;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)(uint)addr3.super_CService.super_CNetAddr.m_addr._union._4_4_ << 0x20);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr1,&local_210,0x472,1,2,pCVar6,"addrman->Size( std::nullopt, std::nullopt)",&addr3,
             "0U");
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x473;
  file_00.m_begin = (iterator)&local_220;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_230,
             msg_00);
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_238 = "";
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x100000001,(optional<bool>)0x0);
  pCVar6 = &addr2;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
               & 0xffffffff00000000);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr1,&local_240,0x473,1,2,pCVar6,"addrman->Size( NET_IPV4, std::nullopt)",&addr3,"0U"
            );
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pCVar6;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x474;
  file_01.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_268 = "";
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x101);
  pCVar6 = &addr2;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
               & 0xffffffff00000000);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr1,&local_270,0x474,1,2,pCVar6,"addrman->Size( std::nullopt, true)",&addr3,"0U");
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x475;
  file_02.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_290,
             msg_02);
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_298 = "";
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x100000001,(optional<bool>)0x100);
  pCVar6 = &addr2;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
               & 0xffffffff00000000);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr1,&local_2a0,0x475,1,2,pCVar6,"addrman->Size( NET_IPV4, false)",&addr3,"0U");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr2,"250.1.1.1",(allocator<char> *)&addr3);
  ResolveService(&local_b8,(string *)&addr2,0x208d);
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffa00;
  ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)in_stack_fffffffffffff9f8;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffa08;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffa10;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffa10 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffffa18;
  CAddress::CAddress(&addr1,ipIn,(ServiceFlags)&local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8);
  std::__cxx11::string::~string((string *)&addr2);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar6;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x479;
  file_03.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2c0,
             msg_03);
  _Var2 = addrman;
  CAddress::CAddress(&addr2,&addr1);
  __l._M_len = 1;
  __l._M_array = &addr2;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr,__l,
             (allocator_type *)&local_488);
  _cVar10 = 0x2048b9;
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr,&source,(seconds)0x0);
  local_1d8.direct[0] = (char)rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  addr3.super_CService.super_CNetAddr._24_8_ = &local_4c8;
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb507d6;
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb507f3;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2c8 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)&addr3,1,0,WARN,_cVar10,
             (size_t)&local_2d0,0x479);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x47a;
  file_04.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f0,
             msg_04);
  _Var2 = addrman;
  time = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  _cVar10 = 0x2049ab;
  bVar4 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr1.super_CService,
                        (NodeSeconds)time.__d.__r);
  addr3.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar4;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr3.super_CService.super_CNetAddr.m_addr._size = 0;
  addr3.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_1d8.indirect_contents.indirect = "addrman->Good(addr1)";
  local_1d8._8_8_ = (long)"addrman->Good(addr1)" + 0x14;
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f8 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  addr2.super_CService.super_CNetAddr._24_8_ = (assertion_result *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr3,(lazy_ostream *)&addr2,1,0,WARN,_cVar10,(size_t)&local_300,
             0x47a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&addr3.super_CService.super_CNetAddr.m_addr._size);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr3,"250.1.1.2",(allocator<char> *)&local_1d8);
  ResolveService(&local_118,(string *)&addr3,0x208d);
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffa00;
  ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff9f8;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffa08;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffa10;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffa10 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffffa18;
  CAddress::CAddress(&addr2,ipIn_00,(ServiceFlags)&local_118);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_118);
  std::__cxx11::string::~string((string *)&addr3);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x47c;
  file_05.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_320,
             msg_05);
  _Var2 = addrman;
  CAddress::CAddress(&addr3,&addr2);
  __l_00._M_len = 1;
  __l_00._M_array = &addr3;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_4c8,__l_00,(allocator_type *)&local_4a0);
  _cVar10 = 0x204b1f;
  bVar4 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_4c8,&source,
                       (seconds)0x0);
  i2p_addr.super_CNetAddr.m_addr._union.direct[0] = bVar4;
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ = 0;
  i2p_addr.super_CNetAddr.m_addr._size = 0;
  i2p_addr.super_CNetAddr.m_addr._20_4_ = 0;
  local_488._0_8_ = "addrman->Add({addr2}, source)";
  local_488.m_message.px = (element_type *)0xb50826;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)&local_488;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_328 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&i2p_addr,(lazy_ostream *)&local_1d8,1,0,WARN,_cVar10,
             (size_t)&local_330,0x47c);
  boost::detail::shared_count::~shared_count((shared_count *)&i2p_addr.super_CNetAddr.m_addr._size);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_4c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x47e;
  file_06.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_350,
             msg_06);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_358 = "";
  local_1d8.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pppuVar8 = (undefined ***)&local_1d8;
  i2p_addr.super_CNetAddr.m_addr._union._0_4_ = 2;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr3,&local_360,0x47e,1,2,pppuVar8,"addrman->Size( std::nullopt, std::nullopt)",
             &i2p_addr,"2U");
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pppuVar8;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0x47f;
  file_07.m_begin = (iterator)&local_370;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_380,
             msg_07);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388 = "";
  local_1d8.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x100000001,(optional<bool>)0x0);
  pppuVar8 = (undefined ***)&local_1d8;
  i2p_addr.super_CNetAddr.m_addr._union._0_4_ = 2;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr3,&local_390,0x47f,1,2,pppuVar8,"addrman->Size( NET_IPV4, std::nullopt)",&i2p_addr
             ,"2U");
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pppuVar8;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x480;
  file_08.m_begin = (iterator)&local_3a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3b0,
             msg_08);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3b8 = "";
  local_1d8.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x101);
  pppuVar8 = (undefined ***)&local_1d8;
  i2p_addr.super_CNetAddr.m_addr._union._0_4_ = 1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr3,&local_3c0,0x480,1,2,pppuVar8,"addrman->Size( std::nullopt, true)",&i2p_addr,
             "1U");
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pppuVar8;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0x481;
  file_09.m_begin = (iterator)&local_3d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3e0,
             msg_09);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3e8 = "";
  local_1d8.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x100);
  pppuVar8 = (undefined ***)&local_1d8;
  i2p_addr.super_CNetAddr.m_addr._union._0_4_ = 1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr3,&local_3f0,0x481,1,2,pppuVar8,"addrman->Size( std::nullopt, false)",&i2p_addr,
             "1U");
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pppuVar8;
  msg_10.m_begin = pvVar5;
  file_10.m_end = (iterator)0x482;
  file_10.m_begin = (iterator)&local_400;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_410,
             msg_10);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_418 = "";
  local_1d8.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x100000001,(optional<bool>)0x101);
  pppuVar8 = (undefined ***)&local_1d8;
  i2p_addr.super_CNetAddr.m_addr._union._0_4_ = 1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr3,&local_420,0x482,1,2,pppuVar8,"addrman->Size( NET_IPV4, true)",&i2p_addr,"1U");
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pppuVar8;
  msg_11.m_begin = pvVar5;
  file_11.m_end = (iterator)0x483;
  file_11.m_begin = (iterator)&local_430;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_440,
             msg_11);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_448 = "";
  local_1d8.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x100000001,(optional<bool>)0x100);
  pppuVar8 = (undefined ***)&local_1d8;
  i2p_addr.super_CNetAddr.m_addr._union._0_4_ = 1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr3,&local_450,0x483,1,2,pppuVar8,"addrman->Size( NET_IPV4, false)",&i2p_addr,"1U");
  CService::CService(&i2p_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr3,"UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P",
             (allocator<char> *)&local_1d8);
  CNetAddr::SetSpecial(&i2p_addr.super_CNetAddr,(string *)&addr3);
  std::__cxx11::string::~string((string *)&addr3);
  CService::CService(&local_1a0,&i2p_addr);
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffa00;
  ipIn_01.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff9f8;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffa08;
  ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffffa10;
  ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffa10 >> 0x20);
  ipIn_01._32_8_ = in_stack_fffffffffffffa18;
  CAddress::CAddress(&addr3,ipIn_01,(ServiceFlags)&local_1a0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0);
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pppuVar8;
  msg_12.m_begin = pvVar5;
  file_12.m_end = (iterator)0x489;
  file_12.m_begin = (iterator)&local_460;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_470,
             msg_12);
  _Var2 = addrman;
  CAddress::CAddress((CAddress *)&local_1d8,&addr3);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_1d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_4a0,__l_01,&local_4a1);
  _cVar10 = 0x2051bc;
  bVar4 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_4a0,&source,
                       (seconds)0x0);
  local_488.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_488.m_message.px = (element_type *)0x0;
  local_488.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4b0 = &local_4d8;
  local_4d8 = "addrman->Add({addr3}, source)";
  local_4d0 = "";
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4e0 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_488,(lazy_ostream *)&local_4c8,1,0,WARN,_cVar10,(size_t)&local_4e8,0x489);
  boost::detail::shared_count::~shared_count(&local_488.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_4a0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1d8);
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar5;
  file_13.m_end = (iterator)0x48a;
  file_13.m_begin = (iterator)&local_4f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_508,
             msg_13);
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01139f30;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0xc694e1;
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_510 = "";
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x0,(optional<bool>)0x0);
  pvVar9 = &local_4c8;
  local_488.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x3;
  local_488._1_3_ = 0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_1d8,&local_518,0x48a,1,2,pvVar9,"addrman->Size( std::nullopt, std::nullopt)",
             &local_488,"3U");
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)pvVar9;
  msg_14.m_begin = pvVar5;
  file_14.m_end = (iterator)0x48b;
  file_14.m_begin = (iterator)&local_528;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_538,
             msg_14);
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01139f30;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0xc694e1;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_540 = "";
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x100000001,(optional<bool>)0x0);
  pvVar9 = &local_4c8;
  local_488.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x2;
  local_488._1_3_ = 0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_1d8,&local_548,0x48b,1,2,pvVar9,"addrman->Size( NET_IPV4, std::nullopt)",
             &local_488,"2U");
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)pvVar9;
  msg_15.m_begin = pvVar5;
  file_15.m_end = (iterator)0x48c;
  file_15.m_begin = (iterator)&local_558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_568,
             msg_15);
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01139f30;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0xc694e1;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_570 = "";
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x100000004,(optional<bool>)0x0);
  pvVar9 = &local_4c8;
  local_488.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_488._1_3_ = 0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_1d8,&local_578,0x48c,1,2,pvVar9,"addrman->Size( NET_I2P, std::nullopt)",
             &local_488,"1U");
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)pvVar9;
  msg_16.m_begin = pvVar5;
  file_16.m_end = (iterator)0x48d;
  file_16.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_598,
             msg_16);
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01139f30;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0xc694e1;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5a0 = "";
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x100000004,(optional<bool>)0x101);
  pvVar9 = &local_4c8;
  local_488.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_488._1_3_ = 0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_1d8,&local_5a8,0x48d,1,2,pvVar9,"addrman->Size( NET_I2P, true)",&local_488,"1U")
  ;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)pvVar9;
  msg_17.m_begin = pvVar5;
  file_17.m_end = (iterator)0x48e;
  file_17.m_begin = (iterator)&local_5b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_5c8,
             msg_17);
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01139f30;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0xc694e1;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d0 = "";
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x0,(optional<bool>)0x101);
  pvVar9 = &local_4c8;
  local_488.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x2;
  local_488._1_3_ = 0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_1d8,&local_5d8,0x48e,1,2,pvVar9,"addrman->Size( std::nullopt, true)",&local_488,
             "2U");
  msg_18.m_end = (iterator)pvVar9;
  msg_18.m_begin = pvVar5;
  file_18.m_end = (iterator)0x48f;
  file_18.m_begin = &stack0xfffffffffffffa18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
             (size_t)&stack0xfffffffffffffa08,msg_18);
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01139f30;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0xc694e1;
  local_4c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x0,(optional<bool>)0x100);
  local_488._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_1d8,&stack0xfffffffffffff9f8,0x48f,1,2,&local_4c8,
             "addrman->Size( std::nullopt, false)",&local_488,"1U");
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&i2p_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_size)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    const CNetAddr source = ResolveIP("252.2.2.2");

    // empty addrman
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 0U);

    // add two ipv4 addresses, one to tried and new
    const CAddress addr1{ResolveService("250.1.1.1", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr1}, source));
    BOOST_CHECK(addrman->Good(addr1));
    const CAddress addr2{ResolveService("250.1.1.2", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr2}, source));

    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 1U);

    // add one i2p address to new
    CService i2p_addr;
    i2p_addr.SetSpecial("UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P");
    const CAddress addr3{i2p_addr, NODE_NONE};
    BOOST_CHECK(addrman->Add({addr3}, source));
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 3U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/std::nullopt), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
}